

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::GetActiveDataset
          (CommissionerImpl *this,Handler<ActiveOperationalDataset> *aHandler,uint16_t aDatasetFlags
          )

{
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  local_60;
  undefined1 local_40 [8];
  anon_class_32_1_d0c21527 rawDatasetHandler;
  uint16_t aDatasetFlags_local;
  Handler<ActiveOperationalDataset> *aHandler_local;
  CommissionerImpl *this_local;
  
  rawDatasetHandler.aHandler._M_invoker._6_2_ = aDatasetFlags;
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::function((function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
              *)local_40,aHandler);
  std::
  function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>
  ::
  function<ot::commissioner::CommissionerImpl::GetActiveDataset(std::function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>,unsigned_short)::__0&,void>
            ((function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>
              *)&local_60,(anon_class_32_1_d0c21527 *)local_40);
  (*(this->super_Commissioner)._vptr_Commissioner[0x1b])
            (this,&local_60,(ulong)rawDatasetHandler.aHandler._M_invoker._6_2_);
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::~function(&local_60);
  GetActiveDataset(std::function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>,unsigned_short)
  ::$_0::~__0((__0 *)local_40);
  return;
}

Assistant:

void CommissionerImpl::GetActiveDataset(Handler<ActiveOperationalDataset> aHandler, uint16_t aDatasetFlags)
{
    auto rawDatasetHandler = [aHandler](const ByteArray *aRawDataset, Error aError) {
        Error                    error;
        ActiveOperationalDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = DecodeActiveOperationalDataset(dataset, *aRawDataset));

        aHandler(&dataset, error);
    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    GetRawActiveDataset(rawDatasetHandler, aDatasetFlags);
}